

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

size_t ZSTD_HcFindBestMatch_dictMatchState_selectMLS
                 (ZSTD_matchState_t *ms,BYTE *ip,BYTE *iLimit,size_t *offsetPtr)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  U32 *pUVar4;
  BYTE *pBVar5;
  ZSTD_matchState_t *pZVar6;
  BYTE *pBVar7;
  BYTE *pBVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  size_t sVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong *puVar19;
  ulong *puVar20;
  U32 mls;
  uint uVar21;
  int iVar22;
  long lVar23;
  BYTE *pStart;
  
  uVar11 = (ms->cParams).minMatch;
  mls = (U32)ip;
  if (uVar11 - 6 < 2) {
    pUVar4 = ms->chainTable;
    uVar11 = (ms->cParams).chainLog;
    uVar15 = 1 << ((byte)uVar11 & 0x1f);
    pBVar5 = (ms->window).base;
    uVar1 = (ms->window).dictLimit;
    uVar21 = mls - (int)pBVar5;
    uVar13 = uVar21 - uVar15;
    if (uVar21 < uVar15) {
      uVar13 = 0;
    }
    uVar2 = (ms->window).lowLimit;
    iVar22 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
    uVar11 = ZSTD_insertAndFindFirstIndex_internal
                       (ms,(ZSTD_compressionParameters *)(ulong)uVar11,
                        (BYTE *)(ulong)(ms->cParams).hashLog,mls);
    uVar14 = 3;
    if (uVar2 < uVar11) {
      do {
        puVar20 = (ulong *)(pBVar5 + uVar11);
        if (*(BYTE *)(uVar14 + (long)puVar20) == ip[uVar14]) {
          puVar19 = (ulong *)ip;
          if (ip < iLimit + -7) {
            if (*puVar20 == *(ulong *)ip) {
              lVar9 = (ulong)uVar11 + 8;
              lVar23 = 0;
              do {
                puVar19 = (ulong *)(ip + lVar23 + 8);
                if (iLimit + -7 <= puVar19) {
                  puVar20 = (ulong *)(pBVar5 + lVar23 + lVar9);
                  goto LAB_00462709;
                }
                lVar10 = lVar23 + lVar9;
                lVar23 = lVar23 + 8;
              } while (*(ulong *)(pBVar5 + lVar10) == *puVar19);
              uVar17 = *puVar19 ^ *(ulong *)(pBVar5 + lVar10);
              uVar18 = 0;
              if (uVar17 != 0) {
                for (; (uVar17 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                }
              }
              uVar18 = (uVar18 >> 3 & 0x1fffffff) + lVar23;
            }
            else {
              uVar17 = *(ulong *)ip ^ *puVar20;
              uVar18 = 0;
              if (uVar17 != 0) {
                for (; (uVar17 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                }
              }
              uVar18 = uVar18 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_00462709:
            if ((puVar19 < iLimit + -3) && ((int)*puVar20 == (int)*puVar19)) {
              puVar19 = (ulong *)((long)puVar19 + 4);
              puVar20 = (ulong *)((long)puVar20 + 4);
            }
            if ((puVar19 < iLimit + -1) && ((short)*puVar20 == (short)*puVar19)) {
              puVar19 = (ulong *)((long)puVar19 + 2);
              puVar20 = (ulong *)((long)puVar20 + 2);
            }
            if (puVar19 < iLimit) {
              puVar19 = (ulong *)((long)puVar19 + (ulong)((char)*puVar20 == (char)*puVar19));
            }
            uVar18 = (long)puVar19 - (long)ip;
          }
          if ((uVar14 < uVar18) &&
             (*offsetPtr = (ulong)((uVar21 + 2) - uVar11), uVar14 = uVar18, ip + uVar18 == iLimit))
          break;
        }
        if (uVar11 <= uVar13) break;
        uVar11 = pUVar4[uVar11 & uVar15 - 1];
        iVar22 = iVar22 + -1;
        if ((uVar11 <= uVar2) || (iVar22 == 0)) break;
      } while( true );
    }
    pZVar6 = ms->dictMatchState;
    uVar15 = 1 << ((byte)(pZVar6->cParams).chainLog & 0x1f);
    pBVar7 = (pZVar6->window).nextSrc;
    pBVar8 = (pZVar6->window).base;
    uVar13 = (int)pBVar7 - (int)pBVar8;
    uVar11 = uVar13 - uVar15;
    if (uVar13 < uVar15) {
      uVar11 = 0;
    }
    lVar9 = *(long *)ip;
    if (iVar22 != 0) {
      uVar2 = (pZVar6->window).dictLimit;
      uVar16 = pZVar6->hashTable
               [(ulong)(lVar9 * -0x30e4432340650000) >> (-(char)(pZVar6->cParams).hashLog & 0x3fU)];
      if (uVar2 < uVar16) {
        pUVar4 = pZVar6->chainTable;
        while( true ) {
          iVar22 = iVar22 + -1;
          if (*(int *)(pBVar8 + uVar16) == (int)lVar9) {
            sVar12 = ZSTD_count_2segments
                               (ip + 4,pBVar8 + (ulong)uVar16 + 4,iLimit,pBVar7,pBVar5 + uVar1);
            uVar18 = sVar12 + 4;
            if ((uVar14 < uVar18) &&
               (*offsetPtr = (ulong)(((uVar21 - uVar1) + uVar13 + 2) - uVar16), uVar14 = uVar18,
               ip + uVar18 == iLimit)) {
              return uVar18;
            }
          }
          if (uVar16 <= uVar11) {
            return uVar14;
          }
          if (iVar22 == 0) break;
          uVar16 = pUVar4[uVar16 & uVar15 - 1];
          if (uVar16 <= uVar2) {
            return uVar14;
          }
        }
        return uVar14;
      }
    }
  }
  else if (uVar11 == 5) {
    pUVar4 = ms->chainTable;
    uVar11 = (ms->cParams).chainLog;
    uVar21 = 1 << ((byte)uVar11 & 0x1f);
    pBVar5 = (ms->window).base;
    uVar1 = (ms->window).dictLimit;
    uVar15 = mls - (int)pBVar5;
    uVar13 = uVar15 - uVar21;
    if (uVar15 < uVar21) {
      uVar13 = 0;
    }
    uVar2 = (ms->window).lowLimit;
    iVar22 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
    uVar11 = ZSTD_insertAndFindFirstIndex_internal
                       (ms,(ZSTD_compressionParameters *)(ulong)uVar11,
                        (BYTE *)(ulong)(ms->cParams).hashLog,mls);
    uVar14 = 3;
    if (uVar2 < uVar11) {
      uVar18 = uVar14;
      do {
        puVar20 = (ulong *)(pBVar5 + uVar11);
        if (*(BYTE *)(uVar18 + (long)puVar20) == ip[uVar18]) {
          puVar19 = (ulong *)ip;
          if (ip < iLimit + -7) {
            if (*puVar20 == *(ulong *)ip) {
              lVar9 = (ulong)uVar11 + 8;
              lVar23 = 0;
              do {
                puVar19 = (ulong *)(ip + lVar23 + 8);
                if (iLimit + -7 <= puVar19) {
                  puVar20 = (ulong *)(pBVar5 + lVar23 + lVar9);
                  goto LAB_0046290e;
                }
                lVar10 = lVar23 + lVar9;
                lVar23 = lVar23 + 8;
              } while (*(ulong *)(pBVar5 + lVar10) == *puVar19);
              uVar17 = *puVar19 ^ *(ulong *)(pBVar5 + lVar10);
              uVar14 = 0;
              if (uVar17 != 0) {
                for (; (uVar17 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                }
              }
              uVar14 = (uVar14 >> 3 & 0x1fffffff) + lVar23;
            }
            else {
              uVar17 = *(ulong *)ip ^ *puVar20;
              uVar14 = 0;
              if (uVar17 != 0) {
                for (; (uVar17 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                }
              }
              uVar14 = uVar14 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_0046290e:
            if ((puVar19 < iLimit + -3) && ((int)*puVar20 == (int)*puVar19)) {
              puVar19 = (ulong *)((long)puVar19 + 4);
              puVar20 = (ulong *)((long)puVar20 + 4);
            }
            if ((puVar19 < iLimit + -1) && ((short)*puVar20 == (short)*puVar19)) {
              puVar19 = (ulong *)((long)puVar19 + 2);
              puVar20 = (ulong *)((long)puVar20 + 2);
            }
            if (puVar19 < iLimit) {
              puVar19 = (ulong *)((long)puVar19 + (ulong)((char)*puVar20 == (char)*puVar19));
            }
            uVar14 = (long)puVar19 - (long)ip;
          }
          if ((uVar18 < uVar14) &&
             (*offsetPtr = (ulong)((uVar15 + 2) - uVar11), uVar18 = uVar14, ip + uVar14 == iLimit))
          break;
        }
        uVar14 = uVar18;
        if (uVar11 <= uVar13) break;
        uVar11 = pUVar4[uVar11 & uVar21 - 1];
        iVar22 = iVar22 + -1;
        if ((uVar11 <= uVar2) || (uVar18 = uVar14, iVar22 == 0)) break;
      } while( true );
    }
    pZVar6 = ms->dictMatchState;
    uVar21 = 1 << ((byte)(pZVar6->cParams).chainLog & 0x1f);
    pBVar7 = (pZVar6->window).nextSrc;
    pBVar8 = (pZVar6->window).base;
    uVar13 = (int)pBVar7 - (int)pBVar8;
    uVar11 = uVar13 - uVar21;
    if (uVar13 < uVar21) {
      uVar11 = 0;
    }
    lVar9 = *(long *)ip;
    if (iVar22 != 0) {
      uVar2 = (pZVar6->window).dictLimit;
      uVar16 = pZVar6->hashTable
               [(ulong)(lVar9 * -0x30e4432345000000) >> (-(char)(pZVar6->cParams).hashLog & 0x3fU)];
      if (uVar2 < uVar16) {
        pUVar4 = pZVar6->chainTable;
        while( true ) {
          iVar22 = iVar22 + -1;
          if (*(int *)(pBVar8 + uVar16) == (int)lVar9) {
            sVar12 = ZSTD_count_2segments
                               (ip + 4,pBVar8 + (ulong)uVar16 + 4,iLimit,pBVar7,pBVar5 + uVar1);
            uVar18 = sVar12 + 4;
            if ((uVar14 < uVar18) &&
               (*offsetPtr = (ulong)(((uVar15 - uVar1) + uVar13 + 2) - uVar16), uVar14 = uVar18,
               ip + uVar18 == iLimit)) {
              return uVar18;
            }
          }
          if (uVar16 <= uVar11) {
            return uVar14;
          }
          if (iVar22 == 0) break;
          uVar16 = pUVar4[uVar16 & uVar21 - 1];
          if (uVar16 <= uVar2) {
            return uVar14;
          }
        }
        return uVar14;
      }
    }
  }
  else {
    pUVar4 = ms->chainTable;
    uVar11 = (ms->cParams).chainLog;
    uVar21 = 1 << ((byte)uVar11 & 0x1f);
    pBVar5 = (ms->window).base;
    uVar1 = (ms->window).dictLimit;
    uVar15 = mls - (int)pBVar5;
    uVar13 = uVar15 - uVar21;
    if (uVar15 < uVar21) {
      uVar13 = 0;
    }
    uVar2 = (ms->window).lowLimit;
    iVar22 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
    uVar11 = ZSTD_insertAndFindFirstIndex_internal
                       (ms,(ZSTD_compressionParameters *)(ulong)uVar11,
                        (BYTE *)(ulong)(ms->cParams).hashLog,mls);
    uVar14 = 3;
    if (uVar2 < uVar11) {
      uVar18 = uVar14;
      do {
        puVar20 = (ulong *)(pBVar5 + uVar11);
        if (*(BYTE *)(uVar18 + (long)puVar20) == ip[uVar18]) {
          puVar19 = (ulong *)ip;
          if (ip < iLimit + -7) {
            if (*puVar20 == *(ulong *)ip) {
              lVar9 = (ulong)uVar11 + 8;
              lVar23 = 0;
              do {
                puVar19 = (ulong *)(ip + lVar23 + 8);
                if (iLimit + -7 <= puVar19) {
                  puVar20 = (ulong *)(pBVar5 + lVar23 + lVar9);
                  goto LAB_00462b11;
                }
                lVar10 = lVar23 + lVar9;
                lVar23 = lVar23 + 8;
              } while (*(ulong *)(pBVar5 + lVar10) == *puVar19);
              uVar17 = *puVar19 ^ *(ulong *)(pBVar5 + lVar10);
              uVar14 = 0;
              if (uVar17 != 0) {
                for (; (uVar17 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                }
              }
              uVar14 = (uVar14 >> 3 & 0x1fffffff) + lVar23;
            }
            else {
              uVar17 = *(ulong *)ip ^ *puVar20;
              uVar14 = 0;
              if (uVar17 != 0) {
                for (; (uVar17 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                }
              }
              uVar14 = uVar14 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_00462b11:
            if ((puVar19 < iLimit + -3) && ((int)*puVar20 == (int)*puVar19)) {
              puVar19 = (ulong *)((long)puVar19 + 4);
              puVar20 = (ulong *)((long)puVar20 + 4);
            }
            if ((puVar19 < iLimit + -1) && ((short)*puVar20 == (short)*puVar19)) {
              puVar19 = (ulong *)((long)puVar19 + 2);
              puVar20 = (ulong *)((long)puVar20 + 2);
            }
            if (puVar19 < iLimit) {
              puVar19 = (ulong *)((long)puVar19 + (ulong)((char)*puVar20 == (char)*puVar19));
            }
            uVar14 = (long)puVar19 - (long)ip;
          }
          if ((uVar18 < uVar14) &&
             (*offsetPtr = (ulong)((uVar15 + 2) - uVar11), uVar18 = uVar14, ip + uVar14 == iLimit))
          break;
        }
        uVar14 = uVar18;
        if (uVar11 <= uVar13) break;
        uVar11 = pUVar4[uVar11 & uVar21 - 1];
        iVar22 = iVar22 + -1;
        if ((uVar11 <= uVar2) || (uVar18 = uVar14, iVar22 == 0)) break;
      } while( true );
    }
    pZVar6 = ms->dictMatchState;
    uVar21 = 1 << ((byte)(pZVar6->cParams).chainLog & 0x1f);
    pBVar7 = (pZVar6->window).nextSrc;
    pBVar8 = (pZVar6->window).base;
    uVar13 = (int)pBVar7 - (int)pBVar8;
    uVar11 = uVar13 - uVar21;
    if (uVar13 < uVar21) {
      uVar11 = 0;
    }
    iVar3 = *(int *)ip;
    if (iVar22 != 0) {
      uVar2 = (pZVar6->window).dictLimit;
      uVar16 = pZVar6->hashTable
               [(uint)(iVar3 * -0x61c8864f) >> (-(char)(pZVar6->cParams).hashLog & 0x1fU)];
      if (uVar2 < uVar16) {
        pUVar4 = pZVar6->chainTable;
        while( true ) {
          iVar22 = iVar22 + -1;
          if (*(int *)(pBVar8 + uVar16) == iVar3) {
            sVar12 = ZSTD_count_2segments
                               (ip + 4,pBVar8 + (ulong)uVar16 + 4,iLimit,pBVar7,pBVar5 + uVar1);
            uVar18 = sVar12 + 4;
            if ((uVar14 < uVar18) &&
               (*offsetPtr = (ulong)(((uVar15 - uVar1) + uVar13 + 2) - uVar16), uVar14 = uVar18,
               ip + uVar18 == iLimit)) {
              return uVar18;
            }
          }
          if (uVar16 <= uVar11) {
            return uVar14;
          }
          if (iVar22 == 0) break;
          uVar16 = pUVar4[uVar16 & uVar21 - 1];
          if (uVar16 <= uVar2) {
            return uVar14;
          }
        }
        return uVar14;
      }
    }
  }
  return uVar14;
}

Assistant:

static size_t ZSTD_HcFindBestMatch_dictMatchState_selectMLS (
                        ZSTD_matchState_t* ms,
                        const BYTE* ip, const BYTE* const iLimit,
                        size_t* offsetPtr)
{
    switch(ms->cParams.minMatch)
    {
    default : /* includes case 3 */
    case 4 : return ZSTD_HcFindBestMatch_generic(ms, ip, iLimit, offsetPtr, 4, ZSTD_dictMatchState);
    case 5 : return ZSTD_HcFindBestMatch_generic(ms, ip, iLimit, offsetPtr, 5, ZSTD_dictMatchState);
    case 7 :
    case 6 : return ZSTD_HcFindBestMatch_generic(ms, ip, iLimit, offsetPtr, 6, ZSTD_dictMatchState);
    }
}